

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

PoolItem * __thiscall soul::PoolAllocator::allocateSpaceForObject(PoolAllocator *this,size_t size)

{
  char *pcVar1;
  size_t sVar2;
  PoolItem *pPVar3;
  Pool *pPVar4;
  ulong uVar5;
  ulong uVar6;
  
  pPVar4 = this->currentPool;
  sVar2 = pPVar4->nextSlot;
  uVar6 = size + 0x1f & 0xfffffffffffffff0;
  uVar5 = sVar2 + uVar6;
  if (0xffe0 < uVar5) {
    addNewPool(this);
    pPVar4 = this->currentPool;
    sVar2 = pPVar4->nextSlot;
    uVar5 = sVar2 + uVar6;
    if (0xffe0 < uVar5) {
      throwInternalCompilerError("currentPool->hasSpaceFor (size)","allocateSpaceForObject",0x14b);
    }
  }
  pPVar3 = (PoolItem *)((pPVar4->space)._M_elems + sVar2);
  pPVar3->size = uVar6;
  pcVar1 = (pPVar4->space)._M_elems + sVar2 + 8;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pPVar4->nextSlot = uVar5;
  return pPVar3;
}

Assistant:

PoolItem& allocateSpaceForObject (size_t size)
    {
        if (! currentPool->hasSpaceFor (size))
        {
            addNewPool();
            SOUL_ASSERT (currentPool->hasSpaceFor (size));
        }

        return currentPool->createItem (size);
    }